

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<kj::ArrayPtr<const_char>_> * __thiscall
kj::_::NullableValue<kj::ArrayPtr<const_char>_>::operator=
          (NullableValue<kj::ArrayPtr<const_char>_> *this,
          NullableValue<kj::ArrayPtr<const_char>_> *other)

{
  NullableValue<kj::ArrayPtr<const_char>_> *other_local;
  NullableValue<kj::ArrayPtr<const_char>_> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<kj::ArrayPtr<char_const>>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      ctor<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>const&>
                (&(this->field_1).value,&(other->field_1).value);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(const NullableValue& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, other.value);
        isSet = true;
      }
    }
    return *this;
  }